

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLElement.cpp
# Opt level: O1

string * __thiscall
iDynTree::XMLElement::description_abi_cxx11_(string *__return_storage_ptr__,XMLElement *this)

{
  XMLElementPimpl *pXVar1;
  pointer psVar2;
  XMLElement *pXVar3;
  string *psVar4;
  ostream *poVar5;
  shared_ptr<iDynTree::XMLElement> *child;
  pointer psVar6;
  _Hash_node_base *p_Var7;
  ostringstream str;
  string local_1d8;
  XMLElement *local_1b8;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<",1);
  pXVar1 = (this->m_pimpl)._M_t.
           super___uniq_ptr_impl<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           .super__Head_base<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(pXVar1->m_name)._M_dataplus._M_p,
             (pXVar1->m_name)._M_string_length);
  p_Var7 = ((__node_base *)
           ((long)&(((this->m_pimpl)._M_t.
                     super___uniq_ptr_impl<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                     .super__Head_base<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_false>.
                    _M_head_impl)->m_attributes)._M_h + 0x10))->_M_nxt;
  local_1b8 = this;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      XMLAttribute::description_abi_cxx11_(&local_1d8,(XMLAttribute *)p_Var7[5]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,">",1);
  pXVar3 = local_1b8;
  std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pXVar1 = (pXVar3->m_pimpl)._M_t.
           super___uniq_ptr_impl<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           .super__Head_base<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_false>._M_head_impl;
  psVar6 = *(pointer *)
            &(pXVar1->m_children).
             super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
             ._M_impl;
  psVar2 = *(pointer *)
            ((long)&(pXVar1->m_children).
                    super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
            + 8);
  local_1b0 = __return_storage_ptr__;
  if (psVar6 != psVar2) {
    do {
      description_abi_cxx11_
                (&local_1d8,
                 (psVar6->super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length
                         );
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar2);
  }
  pXVar3 = local_1b8;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  psVar4 = local_1b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"</",2);
  pXVar1 = (pXVar3->m_pimpl)._M_t.
           super___uniq_ptr_impl<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           .super__Head_base<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_false>._M_head_impl;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(pXVar1->m_name)._M_dataplus._M_p,
                      (pXVar1->m_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string XMLElement::description() const
    {
        std::ostringstream str;
        str << "<" << m_pimpl->m_name;
        for (const auto& attribute : m_pimpl->m_attributes) {
            str << " " << attribute.second->description();
        }
        str << ">" << std::endl;
        for (const auto& child : m_pimpl->m_children) {
            str << child->description() << std::endl;
        }
        str << getParsedTextContent();
        str << "</" << m_pimpl->m_name << ">" << std::endl;
        return str.str();
    }